

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

void INT_REVclear_stored(CMConnection conn,EVstone stone_num,EVaction action_num)

{
  int condition;
  CMFormat format;
  EVclear_stored_request request;
  undefined8 local_38;
  EVaction local_30;
  
  local_30 = 0;
  local_38 = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVclear_stored_req_formats);
  local_38 = CONCAT44(stone_num,condition);
  local_30 = action_num;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVclear_stored_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,(void *)0x0);
  INT_CMwrite(conn,format,&local_38);
  INT_CMCondition_wait(conn->cm,condition);
  return;
}

Assistant:

extern void
INT_REVclear_stored(CMConnection conn, EVstone stone_num, EVaction action_num)
{
    int cond;
    CMFormat f;
    EVclear_stored_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVclear_stored_req_formats);
    request.stone_num = stone_num;
    request.action_num = action_num;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVclear_stored_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
}